

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5Init(sqlite3 *db)

{
  int iVar1;
  int iVar2;
  undefined8 *pAux;
  long lVar3;
  undefined8 *puVar4;
  ulong uVar5;
  void *p;
  undefined **ppuVar6;
  undefined1 *puVar7;
  byte bVar8;
  BuiltinTokenizer aBuiltin [3];
  undefined8 local_88;
  undefined1 local_80 [88];
  
  bVar8 = 0;
  iVar1 = sqlite3_initialize();
  iVar2 = 7;
  if ((iVar1 == 0) && (pAux = (undefined8 *)sqlite3Malloc(0x50), pAux != (undefined8 *)0x0)) {
    pAux[4] = 0;
    pAux[5] = 0;
    *pAux = 0;
    pAux[1] = 0;
    pAux[2] = 0;
    pAux[3] = 0;
    pAux[8] = 0;
    pAux[9] = 0;
    pAux[6] = 0;
    pAux[7] = 0;
    pAux[4] = db;
    *(undefined4 *)pAux = 2;
    pAux[3] = fts5CreateAux;
    pAux[1] = fts5CreateTokenizer;
    pAux[2] = fts5FindTokenizer;
    iVar2 = createModule(db,"fts5",(sqlite3_module *)fts5Init_fts5Mod,pAux,fts5ModuleDestroy);
    if ((iVar2 == 0) &&
       (((iVar2 = createFunctionApi(db,"fts5_decode",2,1,(void *)0x0,fts5DecodeFunction,
                                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                    (_func_void_void_ptr *)0x0), iVar2 == 0 &&
         (iVar2 = createFunctionApi(db,"fts5_decode_none",2,1,db,fts5DecodeFunction,
                                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                    (_func_void_void_ptr *)0x0), iVar2 == 0)) &&
        (iVar2 = createFunctionApi(db,"fts5_rowid",-1,1,(void *)0x0,fts5RowidFunction,
                                   (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                   (_func_void_sqlite3_context_ptr *)0x0,
                                   (_func_void_sqlite3_context_ptr *)0x0,
                                   (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0), iVar2 == 0)))) {
      ppuVar6 = &PTR_fts5ExprFunctionHr_00210b88;
      uVar5 = 0;
      do {
        iVar2 = createFunctionApi(db,ppuVar6[-1],-1,1,pAux,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                  *ppuVar6,(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                            *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
        if (2 < uVar5) break;
        uVar5 = uVar5 + 1;
        ppuVar6 = ppuVar6 + 2;
      } while (iVar2 == 0);
      if (iVar2 == 0) {
        ppuVar6 = &PTR_fts5SnippetFunction_00210bd0;
        uVar5 = 0;
        do {
          iVar2 = (*(code *)pAux[3])(pAux,ppuVar6[-2],0,*ppuVar6);
          if (1 < uVar5) break;
          uVar5 = uVar5 + 1;
          ppuVar6 = ppuVar6 + 4;
        } while (iVar2 == 0);
        if (iVar2 == 0) {
          ppuVar6 = &PTR_anon_var_dwarf_e48ed_00210c20;
          puVar4 = &local_88;
          for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar4 = *ppuVar6;
            ppuVar6 = ppuVar6 + (ulong)bVar8 * -2 + 1;
            puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
          }
          puVar7 = local_80;
          uVar5 = 0;
          do {
            iVar2 = (*(code *)pAux[1])(pAux,*(undefined8 *)(puVar7 + -8),pAux,puVar7);
            if (1 < uVar5) break;
            uVar5 = uVar5 + 1;
            puVar7 = puVar7 + 0x20;
          } while (iVar2 == 0);
          if (((iVar2 == 0) &&
              (iVar2 = createModule(db,"fts5vocab",(sqlite3_module *)sqlite3Fts5VocabInit_fts5Vocab,
                                    pAux,(_func_void_void_ptr *)0x0), iVar2 == 0)) &&
             (iVar2 = createFunctionApi(db,"fts5",1,1,pAux,fts5Fts5Func,
                                        (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                        0x0,(_func_void_sqlite3_context_ptr *)0x0,
                                        (_func_void_sqlite3_context_ptr *)0x0,
                                        (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                        0x0,(_func_void_void_ptr *)0x0), iVar2 == 0)) {
            iVar2 = createFunctionApi(db,"fts5_source_id",0,1,pAux,fts5SourceIdFunc,
                                      (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                      0x0,(_func_void_sqlite3_context_ptr *)0x0,
                                      (_func_void_sqlite3_context_ptr *)0x0,
                                      (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                      0x0,(_func_void_void_ptr *)0x0);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts5Init(sqlite3 *db){
  return fts5Init(db);
}